

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportLight.cpp
# Opt level: O1

void __thiscall
ColladaExportLight_testExportLight_Test::TestBody(ColladaExportLight_testExportLight_Test *this)

{
  pointer *ppbVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> vVar2;
  undefined8 uVar3;
  aiVector2D aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  aiLightSourceType aVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  aiScene *paVar15;
  aiLight *paVar16;
  ColladaExportLight_testExportLight_Test *pCVar17;
  ulong uVar18;
  aiLightSourceType *lhs;
  char *message;
  char *pcVar19;
  char *in_R9;
  aiLight *paVar20;
  bool bVar21;
  bool bVar22;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  uint origNumLights;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  origNames;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff58;
  uint uVar25;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar23;
  undefined7 uVar24;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> expr1
  ;
  AssertHelper local_98;
  internal in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  uint local_6c;
  AssertHelper local_68;
  aiLight *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ColladaExportLight_testExportLight_Test *local_40;
  aiScene *local_38;
  
  paVar15 = Assimp::Importer::ReadFile
                      ((this->super_ColladaExportLight).im,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/lights.dae"
                       ,0x400);
  ppbVar1 = &local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  vVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
          (paVar15 != (aiScene *)0x0);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = vVar2;
  if (paVar15 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff70,(internal *)&local_58,
               (AssertionResult *)"pTest!=NULL","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
               ,0x4e,(char *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70) !=
        &stack0xffffffffffffff80) {
      operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
    }
    if (((in_stack_ffffffffffffff58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar21 = testing::internal::IsTrue(true), bVar21)) &&
       (in_stack_ffffffffffffff58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffff58.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar21 = paVar15->mLights != (aiLight **)0x0;
    bVar22 = paVar15->mNumLights != 0;
    ppbVar1 = &local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar22 && bVar21);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar22 && bVar21) {
      local_40 = this;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_6c = paVar15->mNumLights;
      uVar18 = (ulong)local_6c;
      paVar16 = (aiLight *)operator_new__(uVar18 * 0x46c);
      local_60 = paVar16;
      if (uVar18 != 0) {
        paVar20 = paVar16 + uVar18;
        do {
          (paVar16->mName).length = 0;
          (paVar16->mName).data[0] = '\0';
          memset((paVar16->mName).data + 1,0x1b,0x3ff);
          paVar16->mType = aiLightSource_UNDEFINED;
          (paVar16->mPosition).x = 0.0;
          (paVar16->mPosition).y = 0.0;
          (paVar16->mPosition).z = 0.0;
          (paVar16->mDirection).x = 0.0;
          (paVar16->mDirection).y = 0.0;
          *(undefined8 *)&(paVar16->mDirection).z = 0;
          (paVar16->mUp).x = 0.0;
          (paVar16->mUp).y = 0.0;
          *(undefined8 *)&(paVar16->mUp).z = 0;
          paVar16->mAttenuationLinear = 1.0;
          paVar16->mAttenuationQuadratic = 0.0;
          (paVar16->mColorDiffuse).r = 0.0;
          (paVar16->mColorDiffuse).g = 0.0;
          (paVar16->mColorDiffuse).b = 0.0;
          (paVar16->mColorSpecular).r = 0.0;
          (paVar16->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar16->mColorSpecular).b = 0;
          (paVar16->mColorAmbient).g = 0.0;
          (paVar16->mColorAmbient).b = 0.0;
          paVar16->mAngleInnerCone = 6.2831855;
          paVar16->mAngleOuterCone = 6.2831855;
          (paVar16->mSize).x = 0.0;
          (paVar16->mSize).y = 0.0;
          paVar16 = paVar16 + 1;
        } while (paVar16 != paVar20);
      }
      uVar25 = (uint)((ulong)in_stack_ffffffffffffff58.ptr_ >> 0x20);
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_6c != 0) {
        uVar18 = 0;
        paVar16 = local_60;
        do {
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff70,(paVar15->mLights[uVar18]->mName).data,
                     (allocator *)&stack0xffffffffffffff58);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70);
          if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70) !=
              &stack0xffffffffffffff80) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
          }
          paVar20 = paVar15->mLights[uVar18];
          if (paVar16 != paVar20) {
            uVar25 = (paVar20->mName).length;
            (paVar16->mName).length = uVar25;
            memcpy((paVar16->mName).data,(paVar20->mName).data,(ulong)uVar25);
            (paVar16->mName).data[uVar25] = '\0';
          }
          uVar25 = (uint)((ulong)in_stack_ffffffffffffff58.ptr_ >> 0x20);
          paVar16->mAttenuationQuadratic = paVar20->mAttenuationQuadratic;
          aVar10 = paVar20->mType;
          fVar11 = (paVar20->mPosition).x;
          fVar12 = (paVar20->mPosition).y;
          fVar13 = (paVar20->mPosition).z;
          fVar8 = (paVar20->mDirection).x;
          fVar9 = (paVar20->mDirection).y;
          uVar3 = *(undefined8 *)&(paVar20->mDirection).z;
          fVar5 = (paVar20->mUp).z;
          fVar6 = paVar20->mAttenuationConstant;
          fVar7 = paVar20->mAttenuationLinear;
          (paVar16->mUp).y = (paVar20->mUp).y;
          (paVar16->mUp).z = fVar5;
          paVar16->mAttenuationConstant = fVar6;
          paVar16->mAttenuationLinear = fVar7;
          (paVar16->mDirection).x = fVar8;
          (paVar16->mDirection).y = fVar9;
          *(undefined8 *)&(paVar16->mDirection).z = uVar3;
          paVar16->mType = aVar10;
          (paVar16->mPosition).x = fVar11;
          (paVar16->mPosition).y = fVar12;
          (paVar16->mPosition).z = fVar13;
          (paVar16->mColorDiffuse).r = (paVar20->mColorDiffuse).r;
          (paVar16->mColorDiffuse).g = (paVar20->mColorDiffuse).g;
          (paVar16->mColorDiffuse).b = (paVar20->mColorDiffuse).b;
          (paVar16->mColorSpecular).r = (paVar20->mColorSpecular).r;
          (paVar16->mColorSpecular).g = (paVar20->mColorSpecular).g;
          (paVar16->mColorSpecular).b = (paVar20->mColorSpecular).b;
          (paVar16->mColorAmbient).r = (paVar20->mColorAmbient).r;
          (paVar16->mColorAmbient).g = (paVar20->mColorAmbient).g;
          (paVar16->mColorAmbient).b = (paVar20->mColorAmbient).b;
          fVar5 = paVar20->mAngleOuterCone;
          aVar4 = paVar20->mSize;
          paVar16->mAngleInnerCone = paVar20->mAngleInnerCone;
          paVar16->mAngleOuterCone = fVar5;
          paVar16->mSize = aVar4;
          uVar18 = uVar18 + 1;
          paVar16 = paVar16 + 1;
        } while (uVar18 < local_6c);
      }
      pCVar17 = local_40;
      sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)uVar25 << 0x20);
      pcVar19 = (char *)0x0;
      local_98.data_._0_4_ =
           Assimp::Exporter::Export
                     ((local_40->super_ColladaExportLight).ex,paVar15,"collada","lightsExp.dae",0,
                      (ExportProperties *)0x0);
      testing::internal::CmpHelperEQ<aiReturn,aiReturn>
                ((internal *)&stack0xffffffffffffff70,"aiReturn_SUCCESS",
                 "ex->Export(pTest,\"collada\",file)",(aiReturn *)&stack0xffffffffffffff58,
                 (aiReturn *)&local_98);
      if (in_stack_ffffffffffffff70 == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffff58);
        if (in_stack_ffffffffffffff78.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x59,message);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (sVar23.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar21 = testing::internal::IsTrue(true);
          if ((bVar21) &&
             (sVar23.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)sVar23.ptr_ + 8))();
          }
          sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff78,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      paVar15 = Assimp::Importer::ReadFile
                          ((pCVar17->super_ColladaExportLight).im,"lightsExp.dae",0x400);
      uVar24 = (undefined7)((ulong)sVar23.ptr_ >> 8);
      if (paVar15 == (aiScene *)0x0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&stack0xffffffffffffff70,(internal *)&stack0xffffffffffffff58,
                   (AssertionResult *)"imported!=NULL","false","true",pcVar19);
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x5d,(char *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70) !=
            &stack0xffffffffffffff80) {
          operator_delete((undefined1 *)
                          CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
        }
        if (local_98.data_ != (AssertHelperData *)0x0) {
          bVar21 = testing::internal::IsTrue(true);
          if ((bVar21) && (local_98.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          local_98.data_ = (AssertHelperData *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar21 = paVar15->mLights != (aiLight **)0x0;
        bVar22 = paVar15->mNumLights != 0;
        sVar23.ptr_._1_7_ = uVar24;
        sVar23.ptr_._0_1_ = bVar22 && bVar21;
        expr1.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar22 || !bVar21) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&stack0xffffffffffffff70,(internal *)&stack0xffffffffffffff58,
                     (AssertionResult *)"imported->HasLights()","false","true",pcVar19);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x5f,(char *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70) !=
              &stack0xffffffffffffff80) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
          }
          if (local_98.data_ != (AssertHelperData *)0x0) {
            bVar21 = testing::internal::IsTrue(true);
            if ((bVar21) && (local_98.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_98.data_ + 8))();
            }
            local_98.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&stack0xffffffffffffff70,"origNumLights","imported->mNumLights",
                   &local_6c,&paVar15->mNumLights);
        if (in_stack_ffffffffffffff70 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          if (in_stack_ffffffffffffff78.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar19 = "";
          }
          else {
            pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x60,pcVar19);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          if (sVar23.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar21 = testing::internal::IsTrue(true);
            if ((bVar21) &&
               (sVar23.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)sVar23.ptr_ + 8))();
            }
            sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff78,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_6c != 0) {
          lhs = &local_60->mType;
          pCVar17 = (ColladaExportLight_testExportLight_Test *)&DAT_00000008;
          uVar18 = 0;
          local_38 = paVar15;
          do {
            paVar16 = paVar15->mLights[uVar18];
            sVar23.ptr_ = sVar23.ptr_ & 0xffffffff00000000;
            local_40 = pCVar17;
            iVar14 = strncmp(*(char **)(local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].field_2.
                                        _M_local_buf + 8 + (long)pCVar17),(paVar16->mName).data,
                             *(size_t *)
                              ((long)&((local_58.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + (long)&(pCVar17->super_ColladaExportLight).super_Test))
            ;
            local_98.data_._0_4_ = iVar14;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&stack0xffffffffffffff70,"0",
                       "strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() )"
                       ,(int *)&stack0xffffffffffffff58,(int *)&local_98);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,100,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperEQ<aiLightSourceType,aiLightSourceType>
                      ((internal *)&stack0xffffffffffffff70,"orig->mType","read->mType",lhs,
                       &paVar16->mType);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x65,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mAttenuationConstant",
                       "read->mAttenuationConstant",(float)lhs[10],paVar16->mAttenuationConstant);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x66,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mAttenuationLinear",
                       "read->mAttenuationLinear",(float)lhs[0xb],paVar16->mAttenuationLinear);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x67,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1.ptr_,(char *)sVar23.ptr_,(char *)0x37c952,
                       (double)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x68,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorAmbient.r",
                       "read->mColorAmbient.r",((aiColor3D *)(lhs + 0x13))->r,
                       (paVar16->mColorAmbient).r);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6a,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorAmbient.g",
                       "read->mColorAmbient.g",(float)lhs[0x14],(paVar16->mColorAmbient).g);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6b,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorAmbient.b",
                       "read->mColorAmbient.b",(float)lhs[0x15],(paVar16->mColorAmbient).b);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6c,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorDiffuse.r",
                       "read->mColorDiffuse.r",((aiColor3D *)(lhs + 0xd))->r,
                       (paVar16->mColorDiffuse).r);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6e,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorDiffuse.g",
                       "read->mColorDiffuse.g",(float)lhs[0xe],(paVar16->mColorDiffuse).g);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x6f,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorDiffuse.b",
                       "read->mColorDiffuse.b",(float)lhs[0xf],(paVar16->mColorDiffuse).b);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x70,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorSpecular.r",
                       "read->mColorSpecular.r",((aiColor3D *)(lhs + 0x10))->r,
                       (paVar16->mColorSpecular).r);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x72,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorSpecular.g",
                       "read->mColorSpecular.g",(float)lhs[0x11],(paVar16->mColorSpecular).g);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x73,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&stack0xffffffffffffff70,"orig->mColorSpecular.b",
                       "read->mColorSpecular.b",(float)lhs[0x12],(paVar16->mColorSpecular).b);
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x74,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1.ptr_,(char *)sVar23.ptr_,(char *)0x37d015,
                       (double)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x76,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            testing::internal::DoubleNearPredFormat
                      ((char *)expr1.ptr_,(char *)sVar23.ptr_,(char *)0x37d0d5,
                       (double)in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78.ptr_,
                       (double)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
            paVar15 = local_38;
            if (in_stack_ffffffffffffff70 == (internal)0x0) {
              testing::Message::Message((Message *)&stack0xffffffffffffff58);
              pcVar19 = "";
              if (in_stack_ffffffffffffff78.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar19 = ((in_stack_ffffffffffffff78.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                         ,0x77,pcVar19);
              testing::internal::AssertHelper::operator=
                        (&local_98,(Message *)&stack0xffffffffffffff58);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (sVar23.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar21 = testing::internal::IsTrue(true);
                if ((bVar21) &&
                   (sVar23.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)sVar23.ptr_ + 8))();
                }
                sVar23.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff78,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar18 = uVar18 + 1;
            lhs = lhs + 0x11b;
            pCVar17 = local_40 + 1;
          } while (uVar18 < local_6c);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      operator_delete__(local_60);
    }
    else {
      testing::Message::Message((Message *)&stack0xffffffffffffff58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&stack0xffffffffffffff70,(internal *)&local_58,
                 (AssertionResult *)"pTest->HasLights()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                 ,0x4f,(char *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70));
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&stack0xffffffffffffff58);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70) !=
          &stack0xffffffffffffff80) {
        operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70))
        ;
      }
      if (((in_stack_ffffffffffffff58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar21 = testing::internal::IsTrue(true), bVar21)) &&
         (in_stack_ffffffffffffff58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffff58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)ppbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST_F(ColladaExportLight, testExportLight)
{
    const char* file = "lightsExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/lights.dae", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest!=NULL);
    ASSERT_TRUE(pTest->HasLights());

    const unsigned int origNumLights( pTest->mNumLights );
    std::unique_ptr<aiLight[]> origLights( new aiLight[ origNumLights ] );
    std::vector<std::string> origNames;
    for (size_t i = 0; i < origNumLights; i++) {
        origNames.push_back( pTest->mLights[ i ]->mName.C_Str() );
        origLights[ i ] = *(pTest->mLights[ i ]);
    }

    EXPECT_EQ(AI_SUCCESS,ex->Export(pTest,"collada",file));

    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_TRUE(imported!=NULL);

    EXPECT_TRUE(imported->HasLights());
    EXPECT_EQ( origNumLights,imported->mNumLights );
    for(size_t i=0; i< origNumLights; i++) {
        const aiLight *orig = &origLights[ i ];
        const aiLight *read = imported->mLights[i];
        EXPECT_EQ( 0,strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() ) );
        EXPECT_EQ( orig->mType,read->mType);
        EXPECT_FLOAT_EQ(orig->mAttenuationConstant,read->mAttenuationConstant);
        EXPECT_FLOAT_EQ(orig->mAttenuationLinear,read->mAttenuationLinear);
        EXPECT_NEAR(orig->mAttenuationQuadratic,read->mAttenuationQuadratic, 0.001f);

        EXPECT_FLOAT_EQ(orig->mColorAmbient.r,read->mColorAmbient.r);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.g,read->mColorAmbient.g);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.b,read->mColorAmbient.b);

        EXPECT_FLOAT_EQ(orig->mColorDiffuse.r,read->mColorDiffuse.r);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.g,read->mColorDiffuse.g);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.b,read->mColorDiffuse.b);

        EXPECT_FLOAT_EQ(orig->mColorSpecular.r,read->mColorSpecular.r);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.g,read->mColorSpecular.g);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.b,read->mColorSpecular.b);

        EXPECT_NEAR(orig->mAngleInnerCone,read->mAngleInnerCone,0.001);
        EXPECT_NEAR(orig->mAngleOuterCone,read->mAngleOuterCone,0.001);
    }
}